

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void * region_join(region *region,size_t size)

{
  uint uVar1;
  rlist *prVar2;
  bool bVar3;
  size_t sVar4;
  void *pvVar5;
  ulong local_50;
  size_t offset;
  char *ptr;
  rslab *local_38;
  rslab *slab;
  size_t size_local;
  region *region_local;
  
  sVar4 = region_used(region);
  if (sVar4 < size) {
    __assert_fail("size <= region_used(region)",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                  ,0x71,"void *region_join(struct region *, size_t)");
  }
  if (region->reserved != 0) {
    __assert_fail("!region->reserved",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                  ,0x72,"void *region_join(struct region *, size_t)");
  }
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/region.c"
                  ,0x73,"void *region_join(struct region *, size_t)");
  }
  prVar2 = (region->slabs).slabs.next;
  local_38 = (rslab *)(prVar2 + -1);
  if (*(uint *)&prVar2[2].prev < size) {
    region_local = (region *)region_reserve(region,size);
    local_50 = size;
    if (region_local == (region *)0x0) {
      region_local = (region *)0x0;
    }
    else {
      while( true ) {
        bVar3 = false;
        if (local_50 != 0) {
          bVar3 = local_38->used <= local_50;
        }
        if (!bVar3) break;
        uVar1 = local_38->used;
        pvVar5 = rslab_data(local_38);
        memcpy((void *)((long)region_local + (local_50 - uVar1)),pvVar5,(ulong)local_38->used);
        local_50 = local_50 - local_38->used;
        local_38 = (rslab *)((local_38->slab).next_in_list.next + -1);
      }
      if (local_50 != 0) {
        pvVar5 = rslab_data(local_38);
        memcpy(region_local,(void *)((long)pvVar5 + (local_38->used - local_50)),local_50);
      }
      region_alloc(region,size);
    }
  }
  else {
    pvVar5 = rslab_data(local_38);
    region_local = (region *)((long)pvVar5 + (*(uint *)&prVar2[2].prev - size));
  }
  return region_local;
}

Assistant:

void *
region_join(struct region *region, size_t size)
{
	assert(size <= region_used(region));
	assert(!region->reserved);
	assert(size > 0);
	struct rslab *slab = rlist_first_entry(&region->slabs.slabs,
					       struct rslab,
					       slab.next_in_list);

	if (slab->used >= size) {
		/* Don't move stuff if it's in a single chunk. */
		return (char *) rslab_data(slab) + slab->used - size;
	}
	/**
	 * Use region_reserve() to ensure slab->size is not
	 * changed when the joined region is in the same slab
	 * as the final chunk.
	 */
	char *ptr = region_reserve(region, size);
	size_t offset = size;
	if (ptr == NULL)
		return NULL;
	/*
	 * Copy data from last chunk to first, i.e. in the reverse order.
	 */
	while (offset > 0 && slab->used <= offset) {
		memcpy(ptr + offset - slab->used, rslab_data(slab), slab->used);
		offset -= slab->used;
		slab = rlist_next_entry(slab, slab.next_in_list);
	}
	if (offset > 0)
		memcpy(ptr, rslab_data(slab) + slab->used - offset, offset);
	region_alloc(region, size);
	return ptr;
}